

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int pageant_delete_key(pageant_pubkey *key,char **retstr)

{
  uint uVar1;
  PageantClientOp *pco_00;
  char *pcVar2;
  uint reply;
  PageantClientOp *pco;
  char **retstr_local;
  pageant_pubkey *key_local;
  
  pco_00 = pageant_client_op_new();
  if (key->ssh_version == 1) {
    BinarySink_put_byte(pco_00->binarysink_,'\b');
    BinarySink_put_data(pco_00->binarysink_,key->blob->s,key->blob->len);
  }
  else {
    BinarySink_put_byte(pco_00->binarysink_,'\x12');
    BinarySink_put_string(pco_00->binarysink_,key->blob->s,key->blob->len);
  }
  uVar1 = pageant_client_op_query(pco_00);
  pageant_client_op_free(pco_00);
  if (uVar1 == 6) {
    *retstr = (char *)0x0;
  }
  else {
    pcVar2 = dupstr("Agent failed to delete key");
    *retstr = pcVar2;
  }
  key_local._4_4_ = (uint)(uVar1 != 6);
  return key_local._4_4_;
}

Assistant:

int pageant_delete_key(struct pageant_pubkey *key, char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();

    if (key->ssh_version == 1) {
        put_byte(pco, SSH1_AGENTC_REMOVE_RSA_IDENTITY);
        put_data(pco, key->blob->s, key->blob->len);
    } else {
        put_byte(pco, SSH2_AGENTC_REMOVE_IDENTITY);
        put_string(pco, key->blob->s, key->blob->len);
    }

    unsigned reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);

    if (reply != SSH_AGENT_SUCCESS) {
        *retstr = dupstr("Agent failed to delete key");
        return PAGEANT_ACTION_FAILURE;
    } else {
        *retstr = NULL;
        return PAGEANT_ACTION_OK;
    }
}